

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

void __thiscall ncnn::ParamDict::ParamDict(ParamDict *this)

{
  ParamDictPrivate *this_00;
  
  this->_vptr_ParamDict = (_func_int **)&PTR__ParamDict_005966a8;
  this_00 = (ParamDictPrivate *)operator_new(0xe00);
  ParamDictPrivate::ParamDictPrivate(this_00);
  this->d = this_00;
  clear(this);
  return;
}

Assistant:

ParamDict::ParamDict()
    : d(new ParamDictPrivate)
{
    clear();
}